

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void resetAccumulator(Parse *pParse,AggInfo *pAggInfo)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long in_RSI;
  Parse *in_RDI;
  int nExtra;
  KeyInfo *pKeyInfo_1;
  ExprList *pOBList;
  KeyInfo *pKeyInfo;
  Expr *pE;
  int nReg;
  AggInfo_func *pFunc;
  int i;
  Vdbe *v;
  undefined4 in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  Vdbe *in_stack_ffffffffffffffb0;
  Vdbe *in_stack_ffffffffffffffb8;
  KeyInfo *in_stack_ffffffffffffffc0;
  ExprList *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  long *local_28;
  int local_1c;
  
  iVar2 = *(int *)(in_RSI + 0x30) + *(int *)(in_RSI + 0x20);
  if ((iVar2 != 0) && (in_RDI->nErr == 0)) {
    sqlite3VdbeAddOp3(in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                      (int)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                      in_stack_ffffffffffffffa8);
    local_28 = *(long **)(in_RSI + 0x28);
    for (local_1c = 0; local_1c < *(int *)(in_RSI + 0x30); local_1c = local_1c + 1) {
      if (-1 < (int)local_28[2]) {
        in_stack_ffffffffffffffc8 = (ExprList *)*local_28;
        lVar1._0_4_ = in_stack_ffffffffffffffc8[1].nExpr;
        lVar1._4_4_ = in_stack_ffffffffffffffc8[1].nAlloc;
        if ((lVar1 == 0) || (**(int **)(in_stack_ffffffffffffffc8 + 1) != 1)) {
          sqlite3ErrorMsg(in_RDI,"DISTINCT aggregates must have exactly one argument");
          *(undefined4 *)(local_28 + 2) = 0xffffffff;
        }
        else {
          in_stack_ffffffffffffffc0 =
               sqlite3KeyInfoFromExprList
                         ((Parse *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffc8,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                          (int)in_stack_ffffffffffffffc0);
          iVar3 = sqlite3VdbeAddOp4(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                                    in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                                    in_stack_ffffffffffffffa0,
                                    (char *)CONCAT44(in_stack_ffffffffffffff9c,0xfffffff8),
                                    (int)in_stack_ffffffffffffffc0);
          *(int *)((long)local_28 + 0x14) = iVar3;
          sqlite3VdbeExplain(in_RDI,'\0',"USE TEMP B-TREE FOR %s(DISTINCT)",
                             *(undefined8 *)(local_28[1] + 0x38));
        }
      }
      if (-1 < (int)local_28[3]) {
        in_stack_ffffffffffffffac = (uint)(*(char *)((long)local_28 + 0x1d) == '\0');
        if (*(char *)((long)local_28 + 0x1c) != '\0') {
          in_stack_ffffffffffffffac = **(int **)(*local_28 + 0x20) + in_stack_ffffffffffffffac;
        }
        if (*(char *)((long)local_28 + 0x1e) != '\0') {
          in_stack_ffffffffffffffac = **(int **)(*local_28 + 0x20) + in_stack_ffffffffffffffac;
        }
        in_stack_ffffffffffffffb0 =
             (Vdbe *)sqlite3KeyInfoFromExprList
                               ((Parse *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                                in_stack_ffffffffffffffc8,
                                (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                                (int)in_stack_ffffffffffffffc0);
        if ((*(char *)((long)local_28 + 0x1d) == '\0') && (in_RDI->nErr == 0)) {
          *(short *)((long)&in_stack_ffffffffffffffb0->db + 6) =
               *(short *)((long)&in_stack_ffffffffffffffb0->db + 6) + 1;
        }
        sqlite3VdbeAddOp4(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                          in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                          in_stack_ffffffffffffffa0,
                          (char *)CONCAT44(in_stack_ffffffffffffff9c,0xfffffff8),
                          (int)in_stack_ffffffffffffffc0);
        sqlite3VdbeExplain(in_RDI,'\0',"USE TEMP B-TREE FOR %s(ORDER BY)",
                           *(undefined8 *)(local_28[1] + 0x38));
      }
      local_28 = local_28 + 4;
    }
  }
  return;
}

Assistant:

static void resetAccumulator(Parse *pParse, AggInfo *pAggInfo){
  Vdbe *v = pParse->pVdbe;
  int i;
  struct AggInfo_func *pFunc;
  int nReg = pAggInfo->nFunc + pAggInfo->nColumn;
  assert( pAggInfo->iFirstReg>0 );
  assert( pParse->db->pParse==pParse );
  assert( pParse->db->mallocFailed==0 || pParse->nErr!=0 );
  if( nReg==0 ) return;
  if( pParse->nErr ) return;
  sqlite3VdbeAddOp3(v, OP_Null, 0, pAggInfo->iFirstReg,
                    pAggInfo->iFirstReg+nReg-1);
  for(pFunc=pAggInfo->aFunc, i=0; i<pAggInfo->nFunc; i++, pFunc++){
    if( pFunc->iDistinct>=0 ){
      Expr *pE = pFunc->pFExpr;
      assert( ExprUseXList(pE) );
      if( pE->x.pList==0 || pE->x.pList->nExpr!=1 ){
        sqlite3ErrorMsg(pParse, "DISTINCT aggregates must have exactly one "
           "argument");
        pFunc->iDistinct = -1;
      }else{
        KeyInfo *pKeyInfo = sqlite3KeyInfoFromExprList(pParse, pE->x.pList,0,0);
        pFunc->iDistAddr = sqlite3VdbeAddOp4(v, OP_OpenEphemeral,
            pFunc->iDistinct, 0, 0, (char*)pKeyInfo, P4_KEYINFO);
        ExplainQueryPlan((pParse, 0, "USE TEMP B-TREE FOR %s(DISTINCT)",
                          pFunc->pFunc->zName));
      }
    }
    if( pFunc->iOBTab>=0 ){
      ExprList *pOBList;
      KeyInfo *pKeyInfo;
      int nExtra = 0;
      assert( pFunc->pFExpr->pLeft!=0 );
      assert( pFunc->pFExpr->pLeft->op==TK_ORDER );
      assert( ExprUseXList(pFunc->pFExpr->pLeft) );
      assert( pFunc->pFunc!=0 );
      pOBList = pFunc->pFExpr->pLeft->x.pList;
      if( !pFunc->bOBUnique ){
        nExtra++;  /* One extra column for the OP_Sequence */
      }
      if( pFunc->bOBPayload ){
        /* extra columns for the function arguments */
        assert( ExprUseXList(pFunc->pFExpr) );
        nExtra += pFunc->pFExpr->x.pList->nExpr;
      }
      if( pFunc->bUseSubtype ){
        nExtra += pFunc->pFExpr->x.pList->nExpr;
      }
      pKeyInfo = sqlite3KeyInfoFromExprList(pParse, pOBList, 0, nExtra);
      if( !pFunc->bOBUnique && pParse->nErr==0 ){
        pKeyInfo->nKeyField++;
      }
      sqlite3VdbeAddOp4(v, OP_OpenEphemeral,
            pFunc->iOBTab, pOBList->nExpr+nExtra, 0,
            (char*)pKeyInfo, P4_KEYINFO);
      ExplainQueryPlan((pParse, 0, "USE TEMP B-TREE FOR %s(ORDER BY)",
                          pFunc->pFunc->zName));
    }
  }
}